

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_36::HttpNullEntityWriter::write
          (HttpNullEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  Array<char> local_1c0;
  Exception local_1a8;
  
  kj::_::Debug::makeDescription<char_const(&)[47]>
            ((String *)&local_1c0,(Debug *)"\"HTTP message has no entity-body; can\'t write()\"",
             "HTTP message has no entity-body; can\'t write()",(char (*) [47])__n);
  Exception::Exception
            (&local_1a8,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x989,(String *)&local_1c0);
  Promise<void>::Promise((Promise<void> *)this,&local_1a8);
  Exception::~Exception(&local_1a8);
  Array<char>::~Array(&local_1c0);
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const byte> buffer) override {
    return KJ_EXCEPTION(FAILED, "HTTP message has no entity-body; can't write()");
  }